

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

FileName * __thiscall embree::FileName::setExt(FileName *this,string *ext)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  FileName *in_RDI;
  size_t end;
  size_t start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff88;
  FileName *in_stack_ffffffffffffff90;
  string local_48 [32];
  ulong local_28;
  ulong local_20;
  
  lVar1 = std::__cxx11::string::find_last_of((char)in_RSI,0x2f);
  if (lVar1 == -1) {
    local_20 = 0;
  }
  else {
    local_20 = lVar1 + 1;
  }
  local_28 = std::__cxx11::string::find_last_of((char)in_RSI,0x2e);
  if ((local_28 == 0xffffffffffffffff) || (local_28 < local_20)) {
    std::operator+(in_stack_ffffffffffffff68,in_RSI);
    FileName(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(local_48);
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff68;
    std::__cxx11::string::substr((ulong)__rhs,(ulong)in_RSI);
    std::operator+(in_stack_ffffffffffffff48,__rhs);
    FileName(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  return in_RDI;
}

Assistant:

FileName FileName::setExt(const std::string& ext) const {
    size_t start = filename.find_last_of(path_sep);
    if (start == std::string::npos) start = 0; else start++;
    size_t end = filename.find_last_of('.');
    if (end == std::string::npos || end < start) return FileName(filename+ext);
    return FileName(filename.substr(0,end)+ext);
  }